

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testPatchFromText(diff_match_patch_test *this)

{
  wstring *pwVar1;
  allocator<wchar_t> local_153;
  allocator<wchar_t> local_152;
  allocator<wchar_t> local_151;
  wstring local_150;
  wstring local_130;
  wstring local_110;
  wstring ex;
  size_type local_c0;
  wstring local_a0 [32];
  wstring strp;
  deque<Patch,_std::allocator<Patch>_> local_60;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&strp,L"patch_fromText: #0.",(allocator<wchar_t> *)&local_130);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_150,L"",(allocator<wchar_t> *)&local_110);
  pwVar1 = &ex;
  diff_match_patch::patch_fromText((wstring *)pwVar1);
  assertTrue((diff_match_patch_test *)pwVar1,&strp,local_c0 == ex.field_2._M_allocated_capacity);
  std::deque<Patch,_std::allocator<Patch>_>::~deque((deque<Patch,_std::allocator<Patch>_> *)&ex);
  std::__cxx11::wstring::~wstring((wstring *)&local_150);
  std::__cxx11::wstring::~wstring((wstring *)&strp);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&strp,L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n",
             (allocator<wchar_t> *)&ex);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_150,L"patch_fromText: #1.",(allocator<wchar_t> *)&local_110);
  diff_match_patch::patch_fromText((wstring *)&ex);
  std::_Deque_iterator<Patch,_Patch_&,_Patch_*>::operator[]
            ((_Deque_iterator<Patch,_Patch_&,_Patch_*> *)&ex.field_2,0);
  pwVar1 = &local_130;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar1,&local_150,&strp,&local_130);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::deque<Patch,_std::allocator<Patch>_>::~deque((deque<Patch,_std::allocator<Patch>_> *)&ex);
  std::__cxx11::wstring::~wstring((wstring *)&local_150);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_150,L"patch_fromText: #2.",&local_151);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_130,L"@@ -1 +1 @@\n-a\n+b\n",&local_152);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_a0,L"@@ -1 +1 @@\n-a\n+b\n",&local_153);
  diff_match_patch::patch_fromText((wstring *)&ex);
  std::_Deque_iterator<Patch,_Patch_&,_Patch_*>::operator[]
            ((_Deque_iterator<Patch,_Patch_&,_Patch_*> *)&ex.field_2,0);
  pwVar1 = &local_110;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar1,&local_150,&local_130,&local_110);
  std::__cxx11::wstring::~wstring((wstring *)&local_110);
  std::deque<Patch,_std::allocator<Patch>_>::~deque((deque<Patch,_std::allocator<Patch>_> *)&ex);
  std::__cxx11::wstring::~wstring(local_a0);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::__cxx11::wstring::~wstring((wstring *)&local_150);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_150,L"patch_fromText: #3.",&local_151);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_130,L"@@ -1,3 +0,0 @@\n-abc\n",&local_152);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_a0,L"@@ -1,3 +0,0 @@\n-abc\n",&local_153);
  diff_match_patch::patch_fromText((wstring *)&ex);
  std::_Deque_iterator<Patch,_Patch_&,_Patch_*>::operator[]
            ((_Deque_iterator<Patch,_Patch_&,_Patch_*> *)&ex.field_2,0);
  pwVar1 = &local_110;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar1,&local_150,&local_130,&local_110);
  std::__cxx11::wstring::~wstring((wstring *)&local_110);
  std::deque<Patch,_std::allocator<Patch>_>::~deque((deque<Patch,_std::allocator<Patch>_> *)&ex);
  std::__cxx11::wstring::~wstring(local_a0);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::__cxx11::wstring::~wstring((wstring *)&local_150);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_150,L"patch_fromText: #4.",&local_151);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_130,L"@@ -0,0 +1,3 @@\n+abc\n",&local_152);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_a0,L"@@ -0,0 +1,3 @@\n+abc\n",&local_153);
  diff_match_patch::patch_fromText((wstring *)&ex);
  std::_Deque_iterator<Patch,_Patch_&,_Patch_*>::operator[]
            ((_Deque_iterator<Patch,_Patch_&,_Patch_*> *)&ex.field_2,0);
  pwVar1 = &local_110;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar1,&local_150,&local_130,&local_110);
  std::__cxx11::wstring::~wstring((wstring *)&local_110);
  std::deque<Patch,_std::allocator<Patch>_>::~deque((deque<Patch,_std::allocator<Patch>_> *)&ex);
  std::__cxx11::wstring::~wstring(local_a0);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::__cxx11::wstring::~wstring((wstring *)&local_150);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&ex,L"Bad\nPatch\n",(allocator<wchar_t> *)&local_150);
  diff_match_patch::patch_fromText((wstring *)&local_60);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&ex);
  pwVar1 = &ex;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)pwVar1,L"patch_fromText: #5.",(allocator<wchar_t> *)&local_150);
  assertFalse((diff_match_patch_test *)pwVar1,&ex,true);
  std::__cxx11::wstring::~wstring((wstring *)&ex);
  std::__cxx11::wstring::~wstring((wstring *)&strp);
  return;
}

Assistant:

void diff_match_patch_test::testPatchFromText() {
  assertTrue(L"patch_fromText: #0.", dmp.patch_fromText(L"").empty());

  std::wstring strp = L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n";
  assertEquals(L"patch_fromText: #1.", strp, dmp.patch_fromText(strp)[0].toString());

  assertEquals(L"patch_fromText: #2.", L"@@ -1 +1 @@\n-a\n+b\n", dmp.patch_fromText(L"@@ -1 +1 @@\n-a\n+b\n")[0].toString());

  assertEquals(L"patch_fromText: #3.", L"@@ -1,3 +0,0 @@\n-abc\n", dmp.patch_fromText(L"@@ -1,3 +0,0 @@\n-abc\n")[0].toString());

  assertEquals(L"patch_fromText: #4.", L"@@ -0,0 +1,3 @@\n+abc\n", dmp.patch_fromText(L"@@ -0,0 +1,3 @@\n+abc\n")[0].toString());

  // Generates error.
  try {
    dmp.patch_fromText(L"Bad\nPatch\n");
    assertFalse(L"patch_fromText: #5.", true);
  } catch (std::wstring ex) {
    // Exception expected.
  }
}